

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::scene::CMeshCache::MeshEntry>::sort
          (array<irr::scene::CMeshCache::MeshEntry> *this)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->is_sorted == false) {
    pMVar1 = (this->m_data).
             super__Vector_base<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (this->m_data).
             super__Vector_base<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar1 != pMVar2) {
      uVar4 = ((long)pMVar2 - (long)pMVar1 >> 3) * -0x71c71c71c71c71c7;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar1,pMVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar1,pMVar2);
    }
    this->is_sorted = true;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}